

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

bool __thiscall
lunasvg::SVGEnumeration<lunasvg::SpreadMethod>::parseEnum<3u>
          (SVGEnumeration<lunasvg::SpreadMethod> *this,string_view input,
          SVGEnumerationEntry<lunasvg::SpreadMethod> (*entries) [3])

{
  size_t __n;
  char *__s1;
  int iVar1;
  long lVar2;
  size_type __rlen;
  bool bVar3;
  string_view local_40;
  
  local_40._M_str = input._M_str;
  local_40._M_len = input._M_len;
  stripLeadingAndTrailingSpaces(&local_40);
  __s1 = local_40._M_str;
  __n = local_40._M_len;
  bVar3 = true;
  lVar2 = 0x10;
  while ((__n != *(size_t *)((long)&entries[-1][2].second._M_str + lVar2) ||
         ((__n != 0 && (iVar1 = bcmp(__s1,*(void **)(&(*entries)[0].first + lVar2),__n), iVar1 != 0)
          )))) {
    lVar2 = lVar2 + 0x18;
    bVar3 = lVar2 != 0x58;
    if (!bVar3) {
      return bVar3;
    }
  }
  (this->super_SVGProperty).field_0x9 = *(undefined1 *)((long)&entries[-1][2].second._M_len + lVar2)
  ;
  return bVar3;
}

Assistant:

bool SVGEnumeration<Enum>::parseEnum(std::string_view input, const SVGEnumerationEntry<Enum>(&entries)[N])
{
    stripLeadingAndTrailingSpaces(input);
    for(const auto& entry : entries) {
        if(input == entry.second) {
            m_value = entry.first;
            return true;
        }
    }

    return false;
}